

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::IF(CPU *this)

{
  mapped_type mVar1;
  undefined4 in_EAX;
  longlong lVar2;
  mapped_type *pmVar3;
  I_class *this_00;
  uchar *puVar4;
  undefined8 uStack_28;
  
  puVar4 = (this->CPU_MEM).mem;
  uStack_28._0_4_ = in_EAX;
  lVar2 = memory::get_PC(&this->CPU_MEM);
  uStack_28 = (ulong)CONCAT14(puVar4[lVar2],(undefined4)uStack_28) & 0x7fffffffff;
  pmVar3 = std::
           map<int,_operation,_std::less<int>,_std::allocator<std::pair<const_int,_operation>_>_>::
           operator[](&orders,(key_type *)((long)&uStack_28 + 4));
  mVar1 = *pmVar3;
  puVar4 = (this->CPU_MEM).mem;
  lVar2 = memory::get_PC(&this->CPU_MEM);
  if (mVar1 < I3) {
    puVar4 = puVar4 + lVar2;
    switch(mVar1) {
    case lui:
      this_00 = (I_class *)operator_new(0x28);
      Lui::Lui((Lui *)this_00,puVar4);
      break;
    case auipc:
      this_00 = (I_class *)operator_new(0x28);
      Auipc::Auipc((Auipc *)this_00,puVar4);
      break;
    case jal:
      this_00 = (I_class *)operator_new(0x30);
      Jal::Jal((Jal *)this_00,puVar4);
      break;
    case jalr:
      this_00 = (I_class *)operator_new(0x38);
      Jalr::Jalr((Jalr *)this_00,puVar4);
      break;
    case B:
      this_00 = (I_class *)operator_new(0x38);
      Control::Control((Control *)this_00,puVar4);
      break;
    case ld:
      this_00 = (I_class *)operator_new(0x40);
      Load::Load((Load *)this_00,puVar4);
      break;
    case S:
      this_00 = (I_class *)operator_new(0x40);
      Store::Store((Store *)this_00,puVar4);
      break;
    case I:
      this_00 = (I_class *)operator_new(0x40);
      I_class::I_class(this_00,puVar4);
      break;
    case R:
      this_00 = (I_class *)operator_new(0x40);
      R_class::R_class((R_class *)this_00,puVar4);
    }
    this->current_order = &this_00->super_order;
  }
  return;
}

Assistant:

void CPU::IF() {
    int order_int=int(CPU_MEM.mem[CPU_MEM.get_PC()]);
    order_int%=128;
    operation op=orders[order_int];
    unsigned char *data=CPU_MEM.mem+CPU_MEM.get_PC();
    switch(op){
        case lui:{current_order=new Lui(data); break;}
        case auipc:{current_order=new Auipc(data);break;}
        case jal:{current_order=new Jal(data);break;}
        case jalr:{current_order=new Jalr(data);break;}
        case B:{current_order=new Control(data);break;}
        case ld:{current_order=new Load(data);break;}
        case S:{current_order=new Store(data);break;}
        case I:{current_order=new I_class(data);break;}
        case R:{current_order=new R_class(data);break;}
    }
}